

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O1

int TVMCbArgToReturn(TVMValue *value,int code)

{
  ostream *poVar1;
  LogCheckError _check_err;
  int tcode;
  TVMRetValue rv;
  LogCheckError local_1c0;
  int local_1b4;
  TVMRetValue local_1b0;
  int local_19c;
  TVMValue local_198;
  int local_190;
  
  local_1b0.super_TVMPODValue_.type_code_ = 4;
  local_198 = (TVMValue)*(TVMValue *)&value->v_ctx;
  local_190 = code;
  tvm::runtime::TVMRetValue::Assign<tvm::runtime::TVMArgValue>
            (&local_1b0,(TVMArgValue *)&local_198.v_type);
  tvm::runtime::TVMRetValue::MoveToCHost(&local_1b0,value,&local_1b4);
  local_198.v_type.code = (undefined1)local_1b4;
  local_198.v_type.bits = local_1b4._1_1_;
  local_198.v_type.lanes = local_1b4._2_2_;
  local_19c = code;
  dmlc::LogCheck_EQ<int,int>((dmlc *)&local_1c0,(int *)&local_198.v_int64,&local_19c);
  if (local_1c0.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_198.v_type,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc"
               ,0x24a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.v_type,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.v_type,"tcode == code",0xd);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_198.v_type,((local_1c0.str)->_M_dataplus)._M_p,
                        (local_1c0.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198.v_type);
  }
  dmlc::LogCheckError::~LogCheckError(&local_1c0);
  tvm::runtime::TVMRetValue::Clear(&local_1b0);
  return 0;
}

Assistant:

int TVMCbArgToReturn(TVMValue* value, int code) {
  API_BEGIN();
  tvm::runtime::TVMRetValue rv;
  rv = tvm::runtime::TVMArgValue(*value, code);
  int tcode;
  rv.MoveToCHost(value, &tcode);
  CHECK_EQ(tcode, code);
  API_END();
}